

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall IR::Code::~Code(Code *this)

{
  Code *this_local;
  
  ~Code(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

const std::string& text() const { return std::get<0>(*this); }